

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

uint32_t CLI::detail::hexConvert(char hc)

{
  undefined4 local_10;
  int hcode;
  char hc_local;
  
  if ((hc < '0') || ('9' < hc)) {
    if ((hc < 'A') || ('F' < hc)) {
      if ((hc < 'a') || ('f' < hc)) {
        local_10 = 0xffffffff;
      }
      else {
        local_10 = (int)hc - 0x57;
      }
    }
    else {
      local_10 = (int)hc - 0x37;
    }
  }
  else {
    local_10 = (int)hc - 0x30;
  }
  return local_10;
}

Assistant:

CLI11_INLINE std::uint32_t hexConvert(char hc) {
    int hcode{0};
    if(hc >= '0' && hc <= '9') {
        hcode = (hc - '0');
    } else if(hc >= 'A' && hc <= 'F') {
        hcode = (hc - 'A' + 10);
    } else if(hc >= 'a' && hc <= 'f') {
        hcode = (hc - 'a' + 10);
    } else {
        hcode = -1;
    }
    return static_cast<uint32_t>(hcode);
}